

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprNode *p1_00;
  Fts5ExprNode *p2_00;
  bool bVar1;
  int local_34;
  int cmp;
  Fts5ExprNode *p2;
  Fts5ExprNode *p1;
  int rc;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  p1._4_4_ = 0;
  p1_00 = pNode->apChild[0];
  p2_00 = *(Fts5ExprNode **)(pNode + 1);
  while( true ) {
    bVar1 = false;
    if (p1._4_4_ == 0) {
      bVar1 = p1_00->bEof == 0;
    }
    if (!bVar1) break;
    local_34 = fts5NodeCompare(pExpr,p1_00,p2_00);
    if (0 < local_34) {
      p1._4_4_ = (*p2_00->xNext)(pExpr,p2_00,1,p1_00->iRowid);
      local_34 = fts5NodeCompare(pExpr,p1_00,p2_00);
    }
    if ((local_34 != 0) || (p2_00->bNomatch != 0)) break;
    p1._4_4_ = (*p1_00->xNext)(pExpr,p1_00,0,0);
  }
  pNode->bEof = p1_00->bEof;
  pNode->bNomatch = p1_00->bNomatch;
  pNode->iRowid = p1_00->iRowid;
  if (p1_00->bEof != 0) {
    fts5ExprNodeZeroPoslist(p2_00);
  }
  return p1._4_4_;
}

Assistant:

static int fts5ExprNodeTest_NOT(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode             /* FTS5_NOT node to advance */
){
  int rc = SQLITE_OK;
  Fts5ExprNode *p1 = pNode->apChild[0];
  Fts5ExprNode *p2 = pNode->apChild[1];
  assert( pNode->nChild==2 );

  while( rc==SQLITE_OK && p1->bEof==0 ){
    int cmp = fts5NodeCompare(pExpr, p1, p2);
    if( cmp>0 ){
      rc = fts5ExprNodeNext(pExpr, p2, 1, p1->iRowid);
      cmp = fts5NodeCompare(pExpr, p1, p2);
    }
    assert( rc!=SQLITE_OK || cmp<=0 );
    if( cmp || p2->bNomatch ) break;
    rc = fts5ExprNodeNext(pExpr, p1, 0, 0);
  }
  pNode->bEof = p1->bEof;
  pNode->bNomatch = p1->bNomatch;
  pNode->iRowid = p1->iRowid;
  if( p1->bEof ){
    fts5ExprNodeZeroPoslist(p2);
  }
  return rc;
}